

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O3

Aig_Obj_t * createConstrained0LiveConeWithDSC(Aig_Man_t *pNewAig,Vec_Ptr_t *signalList)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0 < signalList->nSize) {
    uVar6 = signalList->nSize - 1;
    pAVar4 = pNewAig->pConst1;
    pvVar1 = signalList->pArray[uVar6];
    uVar2 = *(ulong *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x28);
    if (uVar6 != 0) {
      uVar5 = 0;
      do {
        if ((long)signalList->nSize <= (long)uVar5) goto LAB_00596cfa;
        uVar3 = *(ulong *)(((ulong)signalList->pArray[uVar5] & 0xfffffffffffffffe) + 0x28);
        if (uVar3 == 0) {
          __assert_fail("Aig_Regular(pObj)->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/arenaViolation.c"
                        ,0xe2,
                        "Aig_Obj_t *createConstrained0LiveConeWithDSC(Aig_Man_t *, Vec_Ptr_t *)");
        }
        pAVar4 = Aig_And(pNewAig,pAVar4,(Aig_Obj_t *)((uint)signalList->pArray[uVar5] & 1 ^ uVar3));
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    pAVar4 = Aig_Or(pNewAig,(Aig_Obj_t *)((ulong)pAVar4 ^ 1),(Aig_Obj_t *)((uint)pvVar1 & 1 ^ uVar2)
                   );
    return pAVar4;
  }
LAB_00596cfa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t *createConstrained0LiveConeWithDSC( Aig_Man_t *pNewAig, Vec_Ptr_t *signalList )
{
	Aig_Obj_t *pConsequent, *pConsequentCopy, *pAntecedent, *p0LiveCone, *pObj;
	int i, numSigAntecedent;
	
	numSigAntecedent = Vec_PtrSize( signalList ) - 1;

	pAntecedent = Aig_ManConst1( pNewAig );
	pConsequent = (Aig_Obj_t *)Vec_PtrEntry( signalList, numSigAntecedent );
	pConsequentCopy = Aig_NotCond( (Aig_Obj_t *)(Aig_Regular(pConsequent)->pData), Aig_IsComplement( pConsequent ) );

	for(i=0; i<numSigAntecedent; i++ )
	{
		pObj = (Aig_Obj_t *)Vec_PtrEntry( signalList, i );
		assert( Aig_Regular(pObj)->pData );
		pAntecedent = Aig_And( pNewAig, pAntecedent, Aig_NotCond((Aig_Obj_t *)(Aig_Regular(pObj)->pData), Aig_IsComplement(pObj)) );
	}

	p0LiveCone = Aig_Or( pNewAig, Aig_Not(pAntecedent), pConsequentCopy );

	return p0LiveCone;
}